

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sessions.hpp
# Opt level: O2

void __thiscall
ableton::link::
Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::MeasurePeer,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::JoinSessionCallback,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_ableton::platforms::linux::Clock<1>_>
::handleFailedMeasurement
          (Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::MeasurePeer,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::JoinSessionCallback,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_ableton::platforms::linux::Clock<1>_>
           *this,SessionId *id)

{
  bool bVar1;
  pair<__gnu_cxx::__normal_iterator<ableton::link::Session_*,_std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>_>,___gnu_cxx::__normal_iterator<ableton::link::Session_*,_std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>_>_>
  pVar2;
  
  bVar1 = std::operator==((array<unsigned_char,_8UL> *)&this->mCurrent,&id->super_NodeIdArray);
  if (bVar1) {
    scheduleRemeasurement(this);
    return;
  }
  pVar2 = std::
          __equal_range<__gnu_cxx::__normal_iterator<ableton::link::Session*,std::vector<ableton::link::Session,std::allocator<ableton::link::Session>>>,ableton::link::Session,__gnu_cxx::__ops::_Iter_comp_val<ableton::link::Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>&,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,able___:posix::ScanIpIfAddrs,ableton::util::NullLog>&,ableton::platforms::linux::Clock<1>>::SessionIdComp>>
                    ((this->mOtherSessions).
                     super__Vector_base<ableton::link::Session,_std::allocator<ableton::link::Session>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->mOtherSessions).
                     super__Vector_base<ableton::link::Session,_std::allocator<ableton::link::Session>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if ((Session *)pVar2.first._M_current != pVar2.second._M_current._M_current) {
    std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>::erase
              (&this->mOtherSessions,(Session *)pVar2.first._M_current);
    Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
    ::forgetSession((this->mPeers).ref._M_data,id);
  }
  return;
}

Assistant:

void handleFailedMeasurement(const SessionId& id)
  {
    using namespace std;

    debug(mIo->log()) << "Session " << id << " measurement failed.";

    // if we failed to measure for our current session, schedule a
    // retry in the future. Otherwise, remove the session from our set
    // of known sessions (if it is seen again it will be measured as
    // if new).
    if (mCurrent.sessionId == id)
    {
      scheduleRemeasurement();
    }
    else
    {
      const auto range = equal_range(
        begin(mOtherSessions), end(mOtherSessions), Session{id, {}, {}}, SessionIdComp{});
      if (range.first != range.second)
      {
        mOtherSessions.erase(range.first);
        mPeers->forgetSession(id);
      }
    }
  }